

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

ByteData *
cfd::core::ConfidentialTransaction::ConvertToByteData
          (ByteData *__return_storage_ptr__,uint8_t *data,size_t size)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer;
  allocator_type local_31;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30,size,&local_31);
  if (size != 0 && data != (uint8_t *)0x0) {
    memcpy(local_30._M_impl.super__Vector_impl_data._M_start,data,size);
  }
  ByteData::ByteData(__return_storage_ptr__,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_30);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

ByteData ConfidentialTransaction::ConvertToByteData(
    const uint8_t *data, size_t size) {
  std::vector<uint8_t> buffer(size);
  if ((data != nullptr) && (size != 0)) {
    memcpy(buffer.data(), data, size);
  }
  return ByteData(buffer);
}